

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

bool __thiscall CS248::Shader::setMatrixParameter(Shader *this,string *paramName,Matrix4x4 *value)

{
  GLuint GVar1;
  PFNGLGETUNIFORMLOCATIONPROC p_Var2;
  GLint GVar3;
  GLchar *pGVar4;
  long in_RDI;
  int uniformLocation;
  float buf [16];
  bool success;
  float *in_stack_ffffffffffffff98;
  Matrix4x4 *in_stack_ffffffffffffffa0;
  
  anon_unknown_13::convertToGLMatrix(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  p_Var2 = __glewGetUniformLocation;
  GVar1 = *(GLuint *)(in_RDI + 0x50);
  pGVar4 = (GLchar *)std::__cxx11::string::c_str();
  GVar3 = (*p_Var2)(GVar1,pGVar4);
  if (-1 < GVar3) {
    (*__glewUniformMatrix4fv)(GVar3,1,'\0',(GLfloat *)&stack0xffffffffffffff98);
  }
  return -1 < GVar3;
}

Assistant:

bool Shader::setMatrixParameter(const std::string& paramName, const Matrix4x4& value) {

    bool success = true;

    float buf[16];
    convertToGLMatrix(value, buf);

    int uniformLocation = glGetUniformLocation(programId_.id, paramName.c_str());

    if (uniformLocation >= 0)
        glUniformMatrix4fv(uniformLocation, 1, GL_FALSE, buf);
    else 
        success = false;

    return success;
}